

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

UMutableCPTrie * umutablecptrie_clone_63(UMutableCPTrie *other,UErrorCode *pErrorCode)

{
  UBool UVar1;
  MutableCodePointTrie *this;
  MutableCodePointTrie *local_50;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> local_28;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> clone;
  UErrorCode *pErrorCode_local;
  UMutableCPTrie *other_local;
  
  clone.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr =
       (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)
       (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (other == (UMutableCPTrie *)0x0) {
      other_local = (UMutableCPTrie *)0x0;
    }
    else {
      this = (MutableCodePointTrie *)
             icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
      local_50 = (MutableCodePointTrie *)0x0;
      if (this != (MutableCodePointTrie *)0x0) {
        icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
                  (this,(MutableCodePointTrie *)other,
                   (UErrorCode *)
                   clone.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>
                   .ptr);
        local_50 = this;
      }
      icu_63::LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::LocalPointer
                ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_28,
                 local_50,(UErrorCode *)
                          clone.
                          super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>
                          .ptr);
      UVar1 = U_FAILURE(*(UErrorCode *)
                         clone.
                         super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>
                         .ptr);
      if (UVar1 == '\0') {
        other_local = (UMutableCPTrie *)
                      icu_63::LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>
                      ::orphan(&local_28);
      }
      else {
        other_local = (UMutableCPTrie *)0x0;
      }
      icu_63::LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
                ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_28);
    }
  }
  else {
    other_local = (UMutableCPTrie *)0x0;
  }
  return other_local;
}

Assistant:

U_CAPI UMutableCPTrie * U_EXPORT2
umutablecptrie_clone(const UMutableCPTrie *other, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    if (other == nullptr) {
        return nullptr;
    }
    LocalPointer<MutableCodePointTrie> clone(
        new MutableCodePointTrie(*reinterpret_cast<const MutableCodePointTrie *>(other), *pErrorCode), *pErrorCode);
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    return reinterpret_cast<UMutableCPTrie *>(clone.orphan());
}